

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

bool __thiscall
arangodb::velocypack::Builder::closeCompactArrayOrObject
          (Builder *this,ValueLength pos,bool isArray,iterator indexStart,iterator indexEnd)

{
  ulong uVar1;
  ValueLength VVar2;
  ValueLength len;
  ValueLength VVar3;
  ValueLength VVar4;
  byte *pbVar5;
  size_t __n;
  ValueLength value;
  ulong uVar6;
  ulong value_00;
  ulong uVar7;
  
  value_00 = (long)indexEnd._M_current - (long)indexStart._M_current >> 3;
  len = getVariableValueLength(value_00);
  VVar2 = this->_pos;
  VVar3 = getVariableValueLength(((len - pos) + VVar2) - 8);
  value = (VVar3 + (len - pos) + VVar2) - 8;
  VVar4 = getVariableValueLength(value);
  uVar7 = (ulong)(VVar4 != VVar3);
  uVar1 = VVar3 + uVar7;
  if (uVar1 < 9) {
    this->_start[pos] = '\x14' - isArray;
    __n = this->_pos - (pos + 9);
    if (pos + 9 <= this->_pos && __n != 0) {
      memmove(this->_start + uVar1 + pos + 1,this->_start + pos + 9,__n);
    }
    pbVar5 = this->_start + pos;
    for (uVar6 = value + uVar7; pbVar5 = pbVar5 + 1, 0x7f < uVar6; uVar6 = uVar6 >> 7) {
      *pbVar5 = (byte)uVar6 | 0x80;
    }
    *pbVar5 = (byte)uVar6;
    if (8 - uVar1 < len) {
      reserve(this,len);
    }
    pbVar5 = this->_start + VVar3 + len + VVar2 + uVar7 + -9;
    for (; 0x7f < value_00; value_00 = value_00 >> 7) {
      *pbVar5 = (byte)value_00 | 0x80;
      pbVar5 = pbVar5 + -1;
    }
    *pbVar5 = (byte)value_00;
    VVar2 = this->_bufferPtr->_size;
    this->_pos = (this->_pos + len + uVar1) - 8;
    this->_bufferPtr->_size = (VVar2 + len + uVar1) - 8;
    closeLevel(this);
  }
  return uVar1 < 9;
}

Assistant:

bool Builder::closeCompactArrayOrObject(
    ValueLength pos, bool isArray,
    std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);

  // use compact notation
  ValueLength nLen = getVariableValueLength(static_cast<ValueLength>(n));
  VELOCYPACK_ASSERT(nLen > 0);
  ValueLength byteSize = _pos - (pos + 8) + nLen;
  VELOCYPACK_ASSERT(byteSize > 0);
  ValueLength bLen = getVariableValueLength(byteSize);
  byteSize += bLen;
  if (getVariableValueLength(byteSize) != bLen) {
    byteSize += 1;
    bLen += 1;
  }

  if (bLen < 9) {
    // can only use compact notation if total byte length is at most 8 bytes
    // long
    _start[pos] = (isArray ? 0x13 : 0x14);
    ValueLength targetPos = 1 + bLen;

    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }

    // store byte length
    VELOCYPACK_ASSERT(byteSize > 0);
    storeVariableValueLength<false>(_start + pos + 1, byteSize);

    // need additional memory for storing the number of values
    if (nLen > 8 - bLen) {
      reserve(nLen);
    }
    storeVariableValueLength<true>(_start + pos + byteSize - 1,
                                   static_cast<ValueLength>(n));

    rollback(8);
    advance(nLen + bLen);

    closeLevel();

#ifdef VELOCYPACK_DEBUG
    VELOCYPACK_ASSERT(_start[pos] == (isArray ? 0x13 : 0x14));
    VELOCYPACK_ASSERT(byteSize ==
                      readVariableValueLength<false>(_start + pos + 1));
    VELOCYPACK_ASSERT(isArray || _start[pos + 1 + bLen] != 0x00);
    VELOCYPACK_ASSERT(
        n == readVariableValueLength<true>(_start + pos + byteSize - 1));
#endif
    return true;
  }
  return false;
}